

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

void Aig_ManSupportsTest(Aig_Man_t *pMan)

{
  Vec_Ptr_t *p;
  Vec_Ptr_t *vSupps;
  Aig_Man_t *pMan_local;
  
  p = Aig_ManSupports(pMan);
  Vec_VecFree((Vec_Vec_t *)p);
  return;
}

Assistant:

void Aig_ManSupportsTest( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSupps;
    vSupps = Aig_ManSupports( pMan );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
}